

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

GLFWbool isValidElementForJoystick(_GLFWmapelement *e,_GLFWjoystick *js)

{
  uint8_t uVar1;
  
  uVar1 = e->type;
  if (uVar1 == '\x01') {
    if (js->axisCount <= (int)(uint)e->index) {
      return 0;
    }
  }
  else if (uVar1 == '\x02') {
    if (js->buttonCount <= (int)(uint)e->index) {
      return 0;
    }
  }
  else if ((uVar1 == '\x03') && (js->hatCount <= (int)(uint)(e->index >> 4))) {
    return 0;
  }
  return 1;
}

Assistant:

static GLFWbool isValidElementForJoystick(const _GLFWmapelement* e,
                                          const _GLFWjoystick* js)
{
    if (e->type == _GLFW_JOYSTICK_HATBIT && (e->index >> 4) >= js->hatCount)
        return GLFW_FALSE;
    else if (e->type == _GLFW_JOYSTICK_BUTTON && e->index >= js->buttonCount)
        return GLFW_FALSE;
    else if (e->type == _GLFW_JOYSTICK_AXIS && e->index >= js->axisCount)
        return GLFW_FALSE;

    return GLFW_TRUE;
}